

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O1

void __thiscall vkt::DynamicState::DynamicStateBaseClass::initialize(DynamicStateBaseClass *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  VkFormat _format;
  VkPipelineLayout obj;
  DeviceInterface *pDVar3;
  SharedPtrStateBase *pSVar4;
  VkImage _image;
  VkImageView obj_00;
  VkRenderPass obj_01;
  VkFramebuffer obj_02;
  Allocation *pAVar5;
  VkAllocationCallbacks *__dest;
  Buffer *pBVar6;
  VkCommandPool obj_03;
  VkSubpassDescription subpass;
  VkAttachmentDescription attachment;
  deUint32 _queueFamilyIndex;
  VkDevice device;
  Allocator *pAVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  VkDeviceSize _size;
  byte bVar11;
  VkExtent3D _extent;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar20;
  undefined4 uVar21;
  VkStructureType VVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  VkCommandBufferAllocateInfo cmdBufferAllocateInfo;
  undefined1 local_3b8 [8];
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_3b0;
  VkImageLayout local_398;
  VkSharingMode VStack_394;
  VkVertexInputAttributeDescription *pVStack_390;
  pointer local_380;
  pointer local_370;
  pointer local_360;
  pointer local_358;
  pointer local_348;
  pointer local_340;
  pointer local_330;
  pointer local_328;
  pointer local_318;
  Move<vk::VkCommandBuffer_s_*> local_308;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  colorAttachments;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkAttachmentReference colorAttachmentReference;
  FramebufferCreateInfo framebufferCreateInfo;
  RenderPassCreateInfo renderPassCreateInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  ImageCreateInfo targetImageCreateInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar11 = 0;
  device = Context::getDevice((this->super_TestInstance).m_context);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&renderPassCreateInfo,0,(VkPushConstantRange *)0x0);
  if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
    operator_delete((void *)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_,
                    renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ -
                    renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
  }
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_3b8,this->m_vk,device,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = DStack_3b0.m_device;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)DStack_3b0.m_allocator;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_3b8;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = DStack_3b0.m_deviceIface;
  local_3b8 = (undefined1  [8])0x0;
  DStack_3b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_3b0.m_device = (VkDevice)0x0;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  if (local_3b8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_3b0,(VkPipelineLayout)local_3b8);
  }
  uVar16 = 0;
  uVar17 = 0;
  uVar14 = 1;
  uVar15 = 0;
  uVar12 = 1;
  uVar13 = 0;
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar3 = this->m_vk;
  pAVar7 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&renderPassCreateInfo,pDVar3,device,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar7,(MemoryRequirement)0x0);
  pSVar4 = (this->m_colorTargetImage).m_state;
  if (pSVar4 != (SharedPtrStateBase *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_colorTargetImage).m_ptr = (Image *)0x0;
        (*((this->m_colorTargetImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar4 = (this->m_colorTargetImage).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorTargetImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorTargetImage).m_ptr =
         (Image *)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
    (this->m_colorTargetImage).m_state =
         (SharedPtrStateBase *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 8) =
           *(int *)((long)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar2 = (int *)((long)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 8);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
      (**(code **)(*renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext != (void *)0x0) {
        (**(code **)(*renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext + 8))();
      }
      renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
    }
  }
  _image.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&renderPassCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,_image,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&renderPassCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3b8,this->m_vk,device,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = DStack_3b0.m_device;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)DStack_3b0.m_allocator;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_3b8;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = DStack_3b0.m_deviceIface;
  local_3b8 = (undefined1  [8])0x0;
  DStack_3b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_3b0.m_device = (VkDevice)0x0;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_00);
  }
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  if (local_3b8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&DStack_3b0,(VkImageView)local_3b8);
  }
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)local_3b8,this->m_colorAttachmentFormat,VK_SAMPLE_COUNT_1_BIT,
             VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,VK_ATTACHMENT_LOAD_OP_DONT_CARE
             ,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)DStack_3b0.m_deviceIface;
  attachment.flags = local_3b8._0_4_;
  attachment.format = local_3b8._4_4_;
  attachment.loadOp = (int)((ulong)DStack_3b0.m_deviceIface >> 0x20);
  attachment.storeOp = (int)DStack_3b0.m_device;
  attachment.stencilLoadOp = (int)((ulong)DStack_3b0.m_device >> 0x20);
  attachment.stencilStoreOp = (int)DStack_3b0.m_allocator;
  attachment.initialLayout = (int)((ulong)DStack_3b0.m_allocator >> 0x20);
  attachment.finalLayout = local_398;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  Draw::AttachmentReference::AttachmentReference((AttachmentReference *)&framebufferCreateInfo);
  _colorAttachments = &colorAttachmentReference;
  uVar26 = 0;
  uVar27 = 0;
  uVar24 = 0;
  uVar25 = 0;
  VVar22 = framebufferCreateInfo.super_VkFramebufferCreateInfo.sType;
  uVar23 = framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_;
  uVar20 = 0;
  uVar21 = 0;
  uVar18 = 0x6c2636;
  uVar19 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)local_3b8,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_,0,
             (deUint32 *)0x0);
  puVar9 = (undefined8 *)local_3b8;
  puVar10 = (undefined8 *)&stack0xfffffffffffffbc8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar13;
  subpass.flags = uVar12;
  subpass.inputAttachmentCount = uVar14;
  subpass._12_4_ = uVar15;
  subpass.pInputAttachments._0_4_ = uVar16;
  subpass.pInputAttachments._4_4_ = uVar17;
  subpass.colorAttachmentCount = uVar18;
  subpass._28_4_ = uVar19;
  subpass.pColorAttachments._0_4_ = (int)_colorAttachments;
  subpass.pColorAttachments._4_4_ = (int)((ulong)_colorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = uVar20;
  subpass.pResolveAttachments._4_4_ = uVar21;
  subpass.pDepthStencilAttachment._0_4_ = VVar22;
  subpass.pDepthStencilAttachment._4_4_ = uVar23;
  subpass.preserveAttachmentCount = uVar24;
  subpass._60_4_ = uVar25;
  subpass.pPreserveAttachments._0_4_ = uVar26;
  subpass.pPreserveAttachments._4_4_ = uVar27;
  Draw::RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if (local_340 != (pointer)0x0) {
    operator_delete(local_340,(long)local_330 - (long)local_340);
  }
  if (local_358 != (pointer)0x0) {
    operator_delete(local_358,(long)local_348 - (long)local_358);
  }
  if (local_370 != (pointer)0x0) {
    operator_delete(local_370,(long)local_360 - (long)local_370);
  }
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&framebufferCreateInfo,this->m_vk,device,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_3b0.m_device = (VkDevice)framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  DStack_3b0.m_allocator =
       (VkAllocationCallbacks *)
       framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal;
  local_3b8 = (undefined1  [8])framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  DStack_3b0.m_deviceIface =
       (DeviceInterface *)framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal = 0;
  obj_01.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_01);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       DStack_3b0.m_device;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       DStack_3b0.m_allocator;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)local_3b8;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       DStack_3b0.m_deviceIface;
  if (framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
               &framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext,
               (VkRenderPass)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_);
  }
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       colorAttachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  (colorAttachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       colorAttachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,&colorAttachments,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)vertexInputAttributeDescriptions,this->m_vk,
             device,&framebufferCreateInfo.super_VkFramebufferCreateInfo,
             (VkAllocationCallbacks *)0x0);
  DStack_3b0.m_device = (VkDevice)vertexInputAttributeDescriptions[1]._0_8_;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)vertexInputAttributeDescriptions[1]._8_8_;
  local_3b8._0_4_ = vertexInputAttributeDescriptions[0].location;
  local_3b8._4_4_ = vertexInputAttributeDescriptions[0].binding;
  DStack_3b0.m_deviceIface = (DeviceInterface *)vertexInputAttributeDescriptions[0]._8_8_;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0;
  obj_02.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_02);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       DStack_3b0.m_device;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       DStack_3b0.m_allocator;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)local_3b8;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = DStack_3b0.m_deviceIface;
  if (vertexInputAttributeDescriptions[0]._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
               &vertexInputAttributeDescriptions[0].format,
               (VkFramebuffer)vertexInputAttributeDescriptions[0]._0_8_);
  }
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)local_3b8,1,&vertexInputBindingDescription,2,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount = CONCAT44(VStack_394,local_398);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = pVStack_390;
  *(VkDevice *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags =
       DStack_3b0.m_device;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)DStack_3b0.m_allocator;
  *(undefined1 (*) [8])&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo =
       local_3b8;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       DStack_3b0.m_deviceIface;
  _size = (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = this->m_vk;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_3b8,_size,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  pAVar7 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&cmdBufferAllocateInfo,pDVar3,device,(VkBufferCreateInfo *)local_3b8,pAVar7,
             (MemoryRequirement)0x1);
  pSVar4 = (this->m_vertexBuffer).m_state;
  if (pSVar4 != (SharedPtrStateBase *)cmdBufferAllocateInfo.pNext) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_vertexBuffer).m_ptr = (Buffer *)0x0;
        (*((this->m_vertexBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_vertexBuffer).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar4 = (this->m_vertexBuffer).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_vertexBuffer).m_ptr = (Buffer *)cmdBufferAllocateInfo._0_8_;
    (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)cmdBufferAllocateInfo.pNext;
    if (cmdBufferAllocateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)cmdBufferAllocateInfo.pNext + 8) =
           *(int *)((long)cmdBufferAllocateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_vertexBuffer).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (cmdBufferAllocateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar2 = (int *)((long)cmdBufferAllocateInfo.pNext + 8);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      cmdBufferAllocateInfo._4_4_ = 0;
      (**(code **)(*cmdBufferAllocateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)cmdBufferAllocateInfo.pNext + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (cmdBufferAllocateInfo.pNext != (void *)0x0) {
        (**(code **)(*cmdBufferAllocateInfo.pNext + 8))();
      }
      cmdBufferAllocateInfo.pNext = (void *)0x0;
    }
  }
  if (local_380 != (pointer)0x0) {
    operator_delete(local_380,(long)local_370 - (long)local_380);
  }
  pAVar5 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_3b8 = (undefined1  [8])&PTR__Allocation_00d7f278;
  DStack_3b0.m_deviceIface = (DeviceInterface *)(pAVar5->m_memory).m_internal;
  DStack_3b0.m_device = (VkDevice)pAVar5->m_offset;
  __dest = (VkAllocationCallbacks *)pAVar5->m_hostPtr;
  DStack_3b0.m_allocator = __dest;
  ::vk::Allocation::~Allocation((Allocation *)local_3b8);
  memcpy(__dest,(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start,_size);
  pBVar6 = (this->m_vertexBuffer).m_ptr;
  pAVar5 = (pBVar6->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_3b8 = (undefined1  [8])&PTR__Allocation_00d7f278;
  DStack_3b0.m_deviceIface = (DeviceInterface *)(pAVar5->m_memory).m_internal;
  DStack_3b0.m_device = (VkDevice)pAVar5->m_offset;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)pAVar5->m_hostPtr;
  pAVar5 = (pBVar6->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  cmdBufferAllocateInfo._0_8_ = &PTR__Allocation_00d7f278;
  cmdBufferAllocateInfo.pNext = (void *)(pAVar5->m_memory).m_internal;
  cmdBufferAllocateInfo.commandPool.m_internal = pAVar5->m_offset;
  cmdBufferAllocateInfo._24_8_ = pAVar5->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (this->m_vk,device,(VkDeviceMemory)DStack_3b0.m_deviceIface,
             cmdBufferAllocateInfo.commandPool.m_internal,_size);
  ::vk::Allocation::~Allocation((Allocation *)&cmdBufferAllocateInfo);
  ::vk::Allocation::~Allocation((Allocation *)local_3b8);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo,this->m_vk,device,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_3b0.m_device = (VkDevice)cmdBufferAllocateInfo.commandPool.m_internal;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)cmdBufferAllocateInfo._24_8_;
  local_3b8 = (undefined1  [8])cmdBufferAllocateInfo._0_8_;
  DStack_3b0.m_deviceIface = (DeviceInterface *)cmdBufferAllocateInfo.pNext;
  cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferAllocateInfo._4_4_ = 0;
  cmdBufferAllocateInfo.pNext = (void *)0x0;
  cmdBufferAllocateInfo.commandPool.m_internal = 0;
  cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufferAllocateInfo.commandBufferCount = 0;
  obj_03.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj_03);
  }
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       DStack_3b0.m_device;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       DStack_3b0.m_allocator;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_3b8;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       DStack_3b0.m_deviceIface;
  if (cmdBufferAllocateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo.pNext,
               (VkCommandPool)cmdBufferAllocateInfo._0_8_);
  }
  cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufferAllocateInfo.pNext = (void *)0x0;
  cmdBufferAllocateInfo.commandPool.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufferAllocateInfo.commandBufferCount = 1;
  ::vk::allocateCommandBuffer(&local_308,this->m_vk,device,&cmdBufferAllocateInfo);
  DStack_3b0.m_device._0_4_ =
       (VkAttachmentStoreOp)local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device
  ;
  DStack_3b0.m_device._4_4_ =
       local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device._4_4_;
  DStack_3b0.m_allocator._0_4_ =
       (VkAttachmentStoreOp)
       local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  DStack_3b0.m_allocator._4_4_ =
       local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._4_4_;
  local_3b8 = (undefined1  [8])local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  DStack_3b0.m_deviceIface =
       local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar3 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    (*pDVar3->_vptr_DeviceInterface[0x48])
              (pDVar3,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
  }
  *(VkAttachmentStoreOp *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkAttachmentStoreOp)DStack_3b0.m_device;
  *(VkAttachmentLoadOp *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4) =
       DStack_3b0.m_device._4_4_;
  *(VkAttachmentStoreOp *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (VkAttachmentStoreOp)DStack_3b0.m_allocator;
  *(VkImageLayout *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
           m_internal + 4) = DStack_3b0.m_allocator._4_4_;
  *(undefined4 *)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       local_3b8._0_4_;
  *(undefined4 *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
       local_3b8._4_4_;
  *(VkSampleCountFlagBits *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (VkSampleCountFlagBits)DStack_3b0.m_deviceIface;
  *(VkAttachmentLoadOp *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface +
   4) = DStack_3b0.m_deviceIface._4_4_;
  if (local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_3b8 = (undefined1  [8])local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_308.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,device);
  if (colorAttachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorAttachments.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)colorAttachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colorAttachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  if (targetImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(targetImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_pushConstantRanges.
                    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_setLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_setLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DynamicStateBaseClass::initialize (void)
{
	const vk::VkDevice device		= m_context.getDevice();
	const deUint32 queueFamilyIndex = m_context.getUniversalQueueFamilyIndex();

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

	const vk::VkExtent3D targetImageExtent = { WIDTH, HEIGHT, 1 };
	const ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, targetImageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
												vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

	m_colorTargetImage = Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

	const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
	m_colorTargetView = vk::createImageView(m_vk, device, &colorTargetViewInfo);

	RenderPassCreateInfo renderPassCreateInfo;
	renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
															 vk::VK_SAMPLE_COUNT_1_BIT,
															 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_IMAGE_LAYOUT_GENERAL,
															 vk::VK_IMAGE_LAYOUT_GENERAL));

	const vk::VkAttachmentReference colorAttachmentReference =
	{
		0,
		vk::VK_IMAGE_LAYOUT_GENERAL
	};

	renderPassCreateInfo.addSubpass(SubpassDescription(
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		0,
		0,
		DE_NULL,
		1,
		&colorAttachmentReference,
		DE_NULL,
		AttachmentReference(),
		0,
		DE_NULL
		)
		);

	m_renderPass = vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

	std::vector<vk::VkImageView> colorAttachments(1);
	colorAttachments[0] = *m_colorTargetView;

	const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, colorAttachments, WIDTH, HEIGHT, 1);

	m_framebuffer = vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

	const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0,
		(deUint32)sizeof(tcu::Vec4) * 2,
		vk::VK_VERTEX_INPUT_RATE_VERTEX,
	};

	const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},
		{
			1u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			(deUint32)(sizeof(float)* 4),
		}
	};

	m_vertexInputState = PipelineCreateInfo::VertexInputState(
		1,
		&vertexInputBindingDescription,
		2,
		vertexInputAttributeDescriptions);

	const vk::VkDeviceSize dataSize = m_data.size() * sizeof(PositionColorVertex);
	m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize, vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
											m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<unsigned char *>(m_vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], (size_t)dataSize);

	vk::flushMappedMemoryRange(m_vk, device,
		m_vertexBuffer->getBoundMemory().getMemory(),
		m_vertexBuffer->getBoundMemory().getOffset(),
		dataSize);

	const CmdPoolCreateInfo cmdPoolCreateInfo(queueFamilyIndex);
	m_cmdPool = vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);

	const vk::VkCommandBufferAllocateInfo cmdBufferAllocateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,	// VkStructureType			sType;
		DE_NULL,											// const void*				pNext;
		*m_cmdPool,											// VkCommandPool			commandPool;
		vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY,				// VkCommandBufferLevel		level;
		1u,													// deUint32					bufferCount;
	};
	m_cmdBuffer = vk::allocateCommandBuffer(m_vk, device, &cmdBufferAllocateInfo);

	initPipeline(device);
}